

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O1

bool __thiscall chrono::ChOptimizerGenetic::DoOptimize(ChOptimizerGenetic *this)

{
  double dVar1;
  undefined4 uVar2;
  int iVar3;
  ChGenotype **ppCVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  ChLog *pCVar9;
  long lVar10;
  void *__src;
  ChOptimizerGenetic *this_00;
  long lVar11;
  ChGenotype *pCVar12;
  ulong uVar13;
  ChGenotype *pCVar14;
  char *__format;
  bool bVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  
  pCVar9 = GetLog();
  ChStreamOutAscii::operator<<
            (&pCVar9->super_ChStreamOutAscii,"\n\n\nGENETIC OPTIMIZATION STARTED.............\n\n");
  uVar8 = (*(this->super_ChOptimizer)._vptr_ChOptimizer[7])(this);
  CreatePopulation(this,&this->population,*(int *)&(this->super_ChOptimizer).field_0x144);
  InitializePopulation(this);
  this->mutants = 0;
  pCVar9 = GetLog();
  uVar2 = *(undefined4 *)&(pCVar9->super_ChStreamOutAscii).field_0x1c;
  pCVar9 = GetLog();
  *(undefined4 *)&(pCVar9->super_ChStreamOutAscii).field_0x1c = 4;
  ComputeAllFitness(this);
  this->generations_done = 1;
  if (0 < this->max_generations) {
    lVar10 = 1;
    auVar21 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    auVar22 = ZEXT1664(ZEXT816(0x412e847e00000000));
    while( true ) {
      if ((this->crossv_change == DATE) && (this->crossv_changewhen < lVar10)) {
        this->crossover = this->crossv_changeto;
      }
      pCVar14 = *this->population;
      lVar10 = (long)*(int *)&(this->super_ChOptimizer).field_0x144;
      if (0 < lVar10) {
        auVar16 = ZEXT864((ulong)pCVar14->fitness);
        lVar11 = 0;
        do {
          pCVar12 = this->population[lVar11];
          dVar1 = pCVar12->fitness;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = dVar1;
          auVar20 = vandpd_avx(auVar17,auVar21._0_16_);
          uVar6 = vcmppd_avx512vl(auVar20,auVar22._0_16_,4);
          uVar7 = vcmppd_avx512vl(auVar16._0_16_,auVar17,1);
          bVar15 = (bool)((byte)uVar6 & 3 & (byte)uVar7 & 1);
          if (bVar15 != false) {
            pCVar14 = pCVar12;
          }
          auVar16 = ZEXT1664(CONCAT88(auVar16._8_8_,
                                      (ulong)bVar15 * (long)dVar1 + (ulong)!bVar15 * auVar16._0_8_))
          ;
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      ChGenotype::Copy(this->best_indiv,pCVar14);
      (this->super_ChOptimizer).opt_fx = this->best_indiv->fitness;
      PopulationStats(this,&this->average,&this->max_fitness,&this->min_fitness,&this->stdeviation);
      LogOut(this,true);
      if ((this->stop_by_stdeviation == true) && (this->stdeviation <= this->stop_stdeviation))
      break;
      if ((this->stop_by_fitness == true) && (this->stop_fitness <= this->max_fitness)) {
        lVar10 = this->generations_done;
        __format = "OK, imposed max fitness reached in %ld generations";
        goto LAB_007ea796;
      }
      if ((this->super_ChOptimizer).user_break != 0) {
        if ((this->super_ChOptimizer).err_message[0] == '\0') {
          builtin_strncpy((this->super_ChOptimizer).err_message,"OK, user break",0xf);
        }
        goto LAB_007ea79d;
      }
      Crossover(this);
      Mutation(this);
      ComputeAllFitness(this);
      Selection(this);
      auVar20._8_8_ = 0x7fffffffffffffff;
      auVar20._0_8_ = 0x7fffffffffffffff;
      auVar21 = ZEXT1664(auVar20);
      auVar17 = ZEXT816(0x412e847e00000000);
      auVar22 = ZEXT1664(auVar17);
      if (this->elite == true) {
        ppCVar4 = this->population;
        pCVar14 = *ppCVar4;
        iVar3 = *(int *)&(this->super_ChOptimizer).field_0x144;
        lVar10 = (long)iVar3;
        pCVar12 = pCVar14;
        if (0 < lVar10) {
          auVar16 = ZEXT864((ulong)pCVar14->fitness);
          lVar11 = 0;
          do {
            dVar1 = ppCVar4[lVar11]->fitness;
            auVar18._8_8_ = 0;
            auVar18._0_8_ = dVar1;
            auVar5 = vandpd_avx(auVar18,auVar20);
            uVar6 = vcmppd_avx512vl(auVar5,auVar17,4);
            uVar7 = vcmppd_avx512vl(auVar16._0_16_,auVar18,1);
            bVar15 = (bool)((byte)uVar6 & 3 & (byte)uVar7 & 1);
            if (bVar15 != false) {
              pCVar12 = ppCVar4[lVar11];
            }
            auVar16 = ZEXT1664(CONCAT88(auVar16._8_8_,
                                        (ulong)bVar15 * (long)dVar1 + (ulong)!bVar15 * auVar16._0_8_
                                       ));
            lVar11 = lVar11 + 1;
          } while (lVar10 != lVar11);
        }
        if (pCVar12->fitness < this->best_indiv->fitness) {
          if (0 < iVar3) {
            auVar21 = ZEXT864((ulong)pCVar14->fitness);
            lVar11 = 0;
            do {
              dVar1 = ppCVar4[lVar11]->fitness;
              auVar19._8_8_ = 0;
              auVar19._0_8_ = dVar1;
              auVar5 = vandpd_avx(auVar19,auVar20);
              uVar6 = vcmppd_avx512vl(auVar5,auVar17,4);
              uVar7 = vcmppd_avx512vl(auVar19,auVar21._0_16_,1);
              bVar15 = (bool)((byte)uVar6 & 3 & (byte)uVar7 & 1);
              if (bVar15 != false) {
                pCVar14 = ppCVar4[lVar11];
              }
              auVar21 = ZEXT1664(CONCAT88(auVar21._8_8_,
                                          (ulong)bVar15 * (long)dVar1 +
                                          (ulong)!bVar15 * auVar21._0_8_));
              lVar11 = lVar11 + 1;
            } while (lVar10 != lVar11);
          }
          ChGenotype::Copy(pCVar14,this->best_indiv);
          auVar22 = ZEXT1664(ZEXT816(0x412e847e00000000));
          auVar21 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        }
      }
      lVar11 = this->generations_done;
      lVar10 = lVar11 + 1;
      this->generations_done = lVar10;
      if (this->max_generations <= lVar11) goto LAB_007ea79d;
    }
    lVar10 = this->generations_done;
    __format = "OK, imposed standard deviation reached in %ld generations";
LAB_007ea796:
    sprintf((this->super_ChOptimizer).err_message,__format,lVar10);
  }
LAB_007ea79d:
  pCVar9 = GetLog();
  *(undefined4 *)&(pCVar9->super_ChStreamOutAscii).field_0x1c = uVar2;
  if ((long)this->max_generations <= this->generations_done) {
    sprintf((this->super_ChOptimizer).err_message,"OK, all %d generations done");
  }
  pCVar9 = GetLog();
  ChStreamOutAscii::operator<<
            (&pCVar9->super_ChStreamOutAscii,"\n\nGENETIC OPTIMIZATION TERMINATED.");
  pCVar9 = GetLog();
  ChStreamOutAscii::operator<<
            (&pCVar9->super_ChStreamOutAscii,
             "\nResetting the system to the best genotype-variables found:");
  __src = calloc((long)(int)uVar8,8);
  if (0 < (int)uVar8) {
    uVar13 = 0;
    do {
      if ((this->best_indiv->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows <= (long)uVar13) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      dVar1 = (this->best_indiv->genes).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [uVar13];
      *(double *)((long)__src + uVar13 * 8) = dVar1;
      pCVar9 = GetLog();
      ChStreamOutAscii::operator<<(&pCVar9->super_ChStreamOutAscii,"\n   ");
      pCVar9 = GetLog();
      ChStreamOutAscii::operator<<(&pCVar9->super_ChStreamOutAscii,dVar1);
      uVar13 = uVar13 + 1;
    } while (uVar8 != uVar13);
  }
  memcpy((this->super_ChOptimizer).xv,__src,(long)(int)uVar8 << 3);
  free(__src);
  pCVar9 = GetLog();
  ChStreamOutAscii::operator<<
            (&pCVar9->super_ChStreamOutAscii,"\n with fitness (objective fx obtained) equal to = ");
  pCVar9 = GetLog();
  ChStreamOutAscii::operator<<(&pCVar9->super_ChStreamOutAscii,this->best_indiv->fitness);
  this_00 = (ChOptimizerGenetic *)GetLog();
  ChStreamOutAscii::operator<<((ChStreamOutAscii *)this_00,"\n\n\n");
  DeletePopulation(this_00,&this->population,*(int *)&(this->super_ChOptimizer).field_0x144);
  if ((this->super_ChOptimizer).C_vars == 0) {
    free((this->super_ChOptimizer).xv_sup);
    free((this->super_ChOptimizer).xv_inf);
  }
  return true;
}

Assistant:

bool ChOptimizerGenetic::DoOptimize() {
    GetLog() << "\n\n\nGENETIC OPTIMIZATION STARTED.............\n\n";

    int nv = GetNumOfVars();

    // allocate -if needed- the upper-lower boundaries arrays
    /*
        if (!C_vars)
        {
            xv_sup = (double*) calloc (nv, sizeof(double));
            xv_inf = (double*) calloc (nv, sizeof(double));
            int mvar = 0;

            for (ChOptVar* Vovar = optvarlist; Vovar != NULL; Vovar = (ChOptVar*) Vovar->GetNext())
            {
                xv_sup[mvar] = Vovar->GetLimSup();
                xv_inf[mvar] = Vovar->GetLimInf();
                mvar++;
            }
        }
    */

    CreatePopulation(population, popsize);
    InitializePopulation();

    mutants = 0;

    // avoid complete streaming of log during optimization;
    ChLog::eChLogLevel oldfilemode = GetLog().GetCurrentLevel();
    GetLog().SetCurrentLevel(ChLog::CHQUIET);

    // -- COMPUTE FITNESS  (for all individuals of brand-new population, 1st time)
    ComputeAllFitness();

    //
    // THE CYCLE OF OPTIMIZATION,
    // GENERATION BY GENERATION
    //
    for (generations_done = 1; generations_done <= max_generations; generations_done++) {
        if (crossv_change == CrossoverChangeType::DATE)
            if (generations_done > crossv_changewhen)
                crossover = crossv_changeto;

        // -- store the best individual of old population
        best_indiv->Copy(Select_best(population));

        // -- set the value of best found value of FX
        opt_fx = best_indiv->fitness;

        // -- statistics...
        PopulationStats(average, max_fitness, min_fitness, stdeviation);

        // -- log
        LogOut(true);

        // -- break cycle conditions
        if (stop_by_stdeviation)
            if (stdeviation <= stop_stdeviation) {
                sprintf(err_message, "OK, imposed standard deviation reached in %ld generations",
                        (long)generations_done);
                break;
            }
        if (stop_by_fitness)
            if (max_fitness >= stop_fitness) {
                sprintf(err_message, "OK, imposed max fitness reached in %ld generations", (long)generations_done);
                break;
            }

        // -- user break?
        if (user_break) {
            if (*err_message == 0)
                sprintf(err_message, "OK, user break");
            break;
        }

        // -- CROSSOVER
        Crossover();

        // -- MUTATION
        Mutation();

        // -- COMPUTE FITNESS
        ComputeAllFitness();

        // -- SELECTION
        Selection();

        if (elite) {
            if (Select_best(population)->fitness < best_indiv->fitness) {
                Select_worst(population)->Copy(best_indiv);
            }
        }
    }

    GetLog().SetCurrentLevel(oldfilemode);

    if (generations_done >= max_generations)
        sprintf(err_message, "OK, all %d generations done", max_generations);

    // on termination, reset the system at the value of the fenotypes of the best indiv.

    GetLog() << "\n\nGENETIC OPTIMIZATION TERMINATED.";

    GetLog() << "\nResetting the system to the best genotype-variables found:";

    // resetting system  (or xv[] vector) to best individual
    int mvar;
    double* myvars = (double*)calloc(nv, sizeof(double));
    for (mvar = 0; mvar < nv; mvar++) {
        myvars[mvar] = best_indiv->genes(mvar);
        GetLog() << "\n   ";
        GetLog() << myvars[mvar];
    }

    memcpy(xv, myvars, (sizeof(double) * nv));
    //	Vars_to_System(myvars);

    free(myvars);  // delete the array of variables

    GetLog() << "\n with fitness (objective fx obtained) equal to = ";
    GetLog() << best_indiv->fitness;
    GetLog() << "\n\n\n";

    // delete the population, useful anymore...
    DeletePopulation(population, popsize);

    if (!C_vars) {
        free(xv_sup);
        free(xv_inf);
    }

    return true;
}